

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::~RandomFragmentOpCase(RandomFragmentOpCase *this)

{
  ~RandomFragmentOpCase(this);
  operator_delete(this,200);
  return;
}

Assistant:

RandomFragmentOpCase::~RandomFragmentOpCase (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;
}